

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<std::vector<double,std::allocator<double>>>::internalSetData<std::pair<int,int>>
          (Parameter<std::vector<double,_std::allocator<double>_>_> *this,pair<int,_int> data)

{
  bool bVar1;
  pair<int,_int> in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000038;
  bool result;
  vector<double,_std::allocator<double>_> tmp;
  RepType *this_00;
  RepType local_28;
  pair<int,_int> local_8;
  
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = &local_28;
  local_8 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2b9408);
  bVar1 = ParameterTraits<std::vector<double,std::allocator<double>>>::convert<std::pair<int,int>>
                    (local_8,this_00);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,in_stack_00000038);
  }
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }